

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O2

double bsc_costs_std_1phase_get(bsc_group_t group,bsc_coll_params_t *set,bsc_size_t n)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  
  if (group == (bsc_group_t)0x0) {
    iVar1 = bsp_nprocs();
  }
  else {
    iVar1 = *group;
  }
  dVar4 = bsc_L(BSC_GET);
  uVar3 = 0;
  uVar2 = (ulong)(uint)n;
  if (n < 1) {
    uVar2 = uVar3;
  }
  for (; uVar2 * 0x30 - uVar3 != 0; uVar3 = uVar3 + 0x30) {
    dVar5 = bsc_g(BSC_GET,*(int *)((long)&set->size + uVar3));
    dVar4 = dVar4 + (double)*(int *)((long)&set->size + uVar3) * dVar5 * (double)iVar1;
  }
  return dVar4;
}

Assistant:

double bsc_costs_std_1phase_get( bsc_group_t group,
         bsc_coll_params_t * set, bsc_size_t n )
{
    bsc_size_t i;
    group_t * g = group;
    bsc_pid_t P = g?g->size:bsp_nprocs() ;
    double costs = bsc_L(BSC_GET);
    for ( i = 0; i < n ; ++i )
        costs += bsc_g(BSC_GET, set[i].size) * P * set[i].size;

    return costs;
}